

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

pair<wasm::Expression_*,_wasm::Expression_*> __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
          (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this)

{
  pair<wasm::Expression_*,_wasm::Expression_*> pVar1;
  bool bVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this_local;
  pair<wasm::Expression_*,_wasm::Expression_*> item;
  
  do {
    bVar2 = empty(this);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::Expression *, wasm::Expression *>>::pop() [T = std::pair<wasm::Expression *, wasm::Expression *>]"
                   );
    }
    pvVar3 = std::
             queue<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::deque<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>_>
             ::front(&this->data);
    this_local = (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
                 pvVar3->first;
    item.first = pvVar3->second;
    pmVar4 = std::
             unordered_map<std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
    *pmVar4 = *pmVar4 - 1;
    std::
    queue<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::deque<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>_>
    ::pop(&this->data);
    pmVar4 = std::
             unordered_map<std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
  } while (*pmVar4 != 0);
  pVar1.second = item.first;
  pVar1.first = (Expression *)this_local;
  return pVar1;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }